

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

float Gia_ObjPropagateRequired(Gia_Man_t *p,int iObj,int fUseSorting)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  float *pfVar6;
  float fVar7;
  int pPinPerm [32];
  float pPinDelays [32];
  float local_12c;
  int local_128 [32];
  float local_a8 [32];
  
  pvVar1 = p->pLutLib;
  iVar2 = Gia_ObjIsLut(p,iObj);
  if (iVar2 != 0) {
    if (pvVar1 == (void *)0x0) {
      local_12c = Gia_ObjTimeRequired(p,iObj);
      local_12c = local_12c + -1.0;
      lVar5 = 0;
      while( true ) {
        iVar2 = Gia_ObjLutSize(p,iObj);
        if (iVar2 <= lVar5) break;
        piVar4 = Gia_ObjLutFanins(p,iObj);
        iVar2 = piVar4[lVar5];
        fVar7 = Gia_ObjTimeRequired(p,iVar2);
        if (local_12c < fVar7) {
          Gia_ObjSetTimeRequired(p,iVar2,local_12c);
        }
        lVar5 = lVar5 + 1;
      }
    }
    else {
      iVar2 = *(int *)((long)pvVar1 + 0xc);
      iVar3 = Gia_ObjLutSize(p,iObj);
      pfVar6 = (float *)((long)pvVar1 + (long)iVar3 * 0x84 + 0x94);
      if (iVar2 == 0) {
        local_12c = Gia_ObjTimeRequired(p,iObj);
        local_12c = local_12c - *pfVar6;
        lVar5 = 0;
        while( true ) {
          iVar2 = Gia_ObjLutSize(p,iObj);
          if (iVar2 <= lVar5) break;
          piVar4 = Gia_ObjLutFanins(p,iObj);
          iVar2 = piVar4[lVar5];
          fVar7 = Gia_ObjTimeRequired(p,iVar2);
          if (local_12c < fVar7) {
            Gia_ObjSetTimeRequired(p,iVar2,local_12c);
          }
          lVar5 = lVar5 + 1;
        }
      }
      else if (fUseSorting == 0) {
        local_12c = 0.0;
        lVar5 = 0;
        while( true ) {
          iVar2 = Gia_ObjLutSize(p,iObj);
          if (iVar2 <= lVar5) break;
          piVar4 = Gia_ObjLutFanins(p,iObj);
          iVar2 = piVar4[lVar5];
          local_12c = Gia_ObjTimeRequired(p,iObj);
          local_12c = local_12c - pfVar6[lVar5];
          fVar7 = Gia_ObjTimeRequired(p,iVar2);
          if (local_12c < fVar7) {
            Gia_ObjSetTimeRequired(p,iVar2,local_12c);
          }
          lVar5 = lVar5 + 1;
        }
      }
      else {
        Gia_LutDelayTraceSortPins(p,iObj,local_128,local_a8);
        local_12c = 0.0;
        lVar5 = 0;
        while( true ) {
          iVar2 = Gia_ObjLutSize(p,iObj);
          if (iVar2 <= lVar5) break;
          Gia_ObjLutFanins(p,iObj);
          local_12c = Gia_ObjTimeRequired(p,iObj);
          local_12c = local_12c - pfVar6[lVar5];
          iVar2 = local_128[lVar5];
          iVar3 = Gia_ObjLutFanin(p,iObj,iVar2);
          fVar7 = Gia_ObjTimeRequired(p,iVar3);
          if (local_12c < fVar7) {
            iVar2 = Gia_ObjLutFanin(p,iObj,iVar2);
            Gia_ObjSetTimeRequired(p,iVar2,local_12c);
          }
          lVar5 = lVar5 + 1;
        }
      }
    }
    return local_12c;
  }
  __assert_fail("Gia_ObjIsLut(p, iObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSpeedup.c"
                ,0xb1,"float Gia_ObjPropagateRequired(Gia_Man_t *, int, int)");
}

Assistant:

float Gia_ObjPropagateRequired( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tRequired = 0.0; // Suppress "might be used uninitialized"
    float * pDelays;
    assert( Gia_ObjIsLut(p, iObj) );
    if ( pLutLib == NULL )
    {
        tRequired = Gia_ObjTimeRequired( p, iObj) - (float)1.0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[0];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else 
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired( p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) > tRequired )
                    Gia_ObjSetTimeRequired( p,  Gia_ObjLutFanin(p, iObj,pPinPerm[k]), tRequired );
            }
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                    Gia_ObjSetTimeRequired( p,  iFanin, tRequired );
            }
        }
    }
    return tRequired;
}